

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

void __thiscall ncnn::Layer::Layer(Layer *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Layer_001da260;
  std::__cxx11::string::string((string *)(in_RDI + 3));
  std::__cxx11::string::string((string *)(in_RDI + 7));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11d1d6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11d1e4);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x11d1f5);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x11d206);
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  return;
}

Assistant:

Layer::Layer()
{
    one_blob_only = false;
    support_inplace = false;
    support_vulkan = false;
    support_packing = false;

    support_bf16_storage = false;

#if NCNN_VULKAN
    vkdev = 0;
#endif // NCNN_VULKAN
}